

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<ClassInfoDef>::growAppend
          (QCommonArrayOps<ClassInfoDef> *this,ClassInfoDef *b,ClassInfoDef *e)

{
  long n;
  ClassInfoDef *pCVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<ClassInfoDef> local_48;
  ClassInfoDef *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = ((long)e - (long)b >> 4) * -0x5555555555555555;
    local_48.d = (Data *)0x0;
    local_48.ptr = (ClassInfoDef *)0x0;
    local_48.size = 0;
    pCVar1 = (this->super_Type).super_QGenericArrayOps<ClassInfoDef>.
             super_QArrayDataPointer<ClassInfoDef>.ptr;
    if ((b < pCVar1) ||
       (pCVar1 + (this->super_Type).super_QGenericArrayOps<ClassInfoDef>.
                 super_QArrayDataPointer<ClassInfoDef>.size <= b)) {
      QArrayDataPointer<ClassInfoDef>::detachAndGrow
                ((QArrayDataPointer<ClassInfoDef> *)this,GrowsAtEnd,n,(ClassInfoDef **)0x0,
                 (QArrayDataPointer<ClassInfoDef> *)0x0);
      pCVar1 = b;
    }
    else {
      QArrayDataPointer<ClassInfoDef>::detachAndGrow
                ((QArrayDataPointer<ClassInfoDef> *)this,GrowsAtEnd,n,&local_28,&local_48);
      pCVar1 = local_28;
    }
    QGenericArrayOps<ClassInfoDef>::copyAppend
              ((QGenericArrayOps<ClassInfoDef> *)this,pCVar1,
               (ClassInfoDef *)(((long)e - (long)b) + (long)pCVar1));
    QArrayDataPointer<ClassInfoDef>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }